

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t xor_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                     uint16_t *output)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong lVar10;
  uint16_t *output_00;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i old_02;
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i newval_02;
  short local_136;
  int local_134;
  uint16_t vec6;
  uint16_t vec7;
  int leftoversize;
  uint32_t len;
  uint16_t curB;
  uint16_t curA;
  uint16_t buffer [17];
  uint local_fc;
  uint32_t pos2;
  uint32_t pos1;
  uint32_t len2;
  uint32_t len1;
  uint16_t *initoutput;
  __m128i laststore;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  __m128i vB;
  __m128i vA;
  uint16_t *local_80;
  uint16_t *output_local;
  uint32_t length2_local;
  uint16_t *array2_local;
  uint32_t length1_local;
  uint16_t *array1_local;
  longlong lStack_20;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  
  if ((length1 < 8) || (length2 < 8)) {
    uVar3 = xor_uint16(array1,length1,array2,length2,output);
    return uVar3;
  }
  uVar4 = length1 >> 3;
  uVar5 = length2 >> 3;
  unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])array1);
  local_fc = 1;
  unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])array2);
  register0x00000000 = 1;
  palVar9 = (__m128i *)(V + 1);
  palVar8 = (__m128i *)(laststore + 1);
  output_00 = output;
  sse_merge((__m128i *)(vB + 1),palVar9,(__m128i *)(vecMax + 1),palVar8);
  auVar1 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,0xffff,7);
  lStack_20 = auVar1._8_8_;
  laststore[0] = lStack_20;
  old[1] = (longlong)palVar9;
  old[0] = (longlong)output;
  newval[1] = (longlong)palVar8;
  newval[0] = extraout_RDX;
  iVar6 = store_unique_xor(old,newval,output_00);
  local_80 = output + iVar6;
  laststore[0] = vecMin[0];
  lVar10 = extraout_RDX_00;
  uVar2 = 1;
  if ((1 < uVar4) && (uVar2 = local_fc, stack0xffffffffffffff00 < uVar5)) {
    leftoversize._2_2_ = array1[8];
    leftoversize._0_2_ = array2[stack0xffffffffffffff00 << 3];
    local_fc = 1;
    do {
      if ((uint16_t)leftoversize < leftoversize._2_2_) {
        unique0x000f2500 =
             vlddqu_avx(*(undefined1 (*) [16])(array2 + (ulong)stack0xffffffffffffff00 * 8));
        register0x00000000 = stack0xffffffffffffff00 + 1;
        if (uVar5 <= register0x00000000) goto LAB_0010500b;
        leftoversize._0_2_ = array2[register0x00000000 * 8];
      }
      else {
        unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(array1 + (ulong)local_fc * 8));
        local_fc = local_fc + 1;
        if (uVar4 <= local_fc) goto LAB_0010500b;
        leftoversize._2_2_ = array1[local_fc * 8];
      }
      palVar9 = (__m128i *)(laststore + 1);
      palVar8 = palVar9;
      sse_merge((__m128i *)(vecMin + 1),palVar9,(__m128i *)(vecMax + 1),palVar9);
      old_00[1] = (longlong)palVar8;
      old_00[0] = (longlong)local_80;
      newval_00[1] = (longlong)palVar9;
      newval_00[0] = extraout_RDX_01;
      iVar6 = store_unique_xor(old_00,newval_00,output_00);
      local_80 = local_80 + iVar6;
    } while( true );
  }
LAB_00105064:
  local_fc = uVar2;
  old_02[1] = (longlong)palVar9;
  old_02[0] = (longlong)&len;
  newval_02[1] = (longlong)output;
  newval_02[0] = lVar10;
  iVar6 = store_unique_xor(old_02,newval_02,output_00);
  vpextrw_avx(stack0xffffffffffffff28,7);
  uVar7 = vpextrw_avx(stack0xffffffffffffff28,6);
  local_134 = iVar6;
  if (local_136 != (short)uVar7) {
    local_134 = iVar6 + 1;
    *(short *)((long)&len + (long)iVar6 * 2) = local_136;
  }
  if (local_fc == uVar4) {
    memcpy((void *)((long)&len + (long)local_134 * 2),array1 + (local_fc << 3),
           (ulong)(length1 + uVar4 * -8) << 1);
    uVar3 = length1 + uVar4 * -8 + local_134;
    if (uVar3 == 0) {
      memcpy(local_80,array2 + (stack0xffffffffffffff00 << 3),
             (ulong)(length2 + stack0xffffffffffffff00 * -8) << 1);
      iVar6 = length2 + stack0xffffffffffffff00 * -8;
    }
    else {
      qsort(&len,(long)(int)uVar3,2,uint16_compare);
      uVar3 = unique_xor((uint16_t *)&len,uVar3);
      iVar6 = xor_uint16((uint16_t *)&len,uVar3,array2 + (stack0xffffffffffffff00 << 3),
                         length2 + stack0xffffffffffffff00 * -8,local_80);
    }
  }
  else {
    memcpy((void *)((long)&len + (long)local_134 * 2),array2 + (stack0xffffffffffffff00 << 3),
           (ulong)(length2 + uVar5 * -8) << 1);
    uVar3 = length2 + uVar5 * -8 + local_134;
    if (uVar3 == 0) {
      memcpy(local_80,array1 + (local_fc << 3),(ulong)(length1 + local_fc * -8) << 1);
      iVar6 = length1 + local_fc * -8;
    }
    else {
      qsort(&len,(long)(int)uVar3,2,uint16_compare);
      uVar3 = unique_xor((uint16_t *)&len,uVar3);
      iVar6 = xor_uint16((uint16_t *)&len,uVar3,array1 + (local_fc << 3),length1 + local_fc * -8,
                         local_80);
    }
  }
  _vec6 = iVar6 + (int)((ulong)((long)local_80 - (long)output) >> 1);
  return _vec6;
LAB_0010500b:
  palVar8 = (__m128i *)(laststore + 1);
  palVar9 = palVar8;
  sse_merge((__m128i *)(vecMin + 1),palVar8,(__m128i *)(vecMax + 1),palVar8);
  old_01[1] = (longlong)palVar9;
  old_01[0] = (longlong)local_80;
  newval_01[1] = (longlong)palVar8;
  newval_01[0] = extraout_RDX_02;
  iVar6 = store_unique_xor(old_01,newval_01,output_00);
  local_80 = local_80 + iVar6;
  laststore[0] = vecMin[0];
  lVar10 = extraout_RDX_03;
  uVar2 = local_fc;
  goto LAB_00105064;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE xor algorithm
uint32_t xor_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                      const uint16_t *__restrict__ array2, uint32_t length2,
                      uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return xor_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    uint16_t buffer[17];
    output += store_unique_xor(laststore, vecMin, output);

    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            // conditionally stores the last value of laststore as well as all
            // but the
            // last value of vecMin
            output += store_unique_xor(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        // conditionally stores the last value of laststore as well as all but
        // the
        // last value of vecMin
        output += store_unique_xor(laststore, vecMin, output);
        laststore = vecMin;
    }
    uint32_t len = (uint32_t)(output - initoutput);

    // we finish the rest off using a scalar algorithm
    // could be improved?
    // conditionally stores the last value of laststore as well as all but the
    // last value of vecMax,
    // we store to "buffer"
    int leftoversize = store_unique_xor(laststore, vecMax, buffer);
    uint16_t vec7 = _mm_extract_epi16(vecMax, 7);
    uint16_t vec6 = _mm_extract_epi16(vecMax, 6);
    if (vec7 != vec6) buffer[leftoversize++] = vec7;
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array2 + 8 * pos2,
                   (length2 - 8 * pos2) * sizeof(uint16_t));
            len += (length2 - 8 * pos2);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array2 + 8 * pos2,
                              length2 - 8 * pos2, output);
        }
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array1 + 8 * pos1,
                   (length1 - 8 * pos1) * sizeof(uint16_t));
            len += (length1 - 8 * pos1);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array1 + 8 * pos1,
                              length1 - 8 * pos1, output);
        }
    }
    return len;
}